

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O3

vector<imrt::Volume,_std::allocator<imrt::Volume>_> *
createVolumes(vector<imrt::Volume,_std::allocator<imrt::Volume>_> *__return_storage_ptr__,
             string *organ_filename,Collimator *collimator)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  string line;
  ifstream organ_file;
  undefined1 auStack_2e8 [8];
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  value_type local_2c0;
  Collimator *local_2a0;
  string local_298;
  Volume local_278;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2a0 = collimator;
  std::ifstream::ifstream(local_238,(organ_filename->_M_dataplus)._M_p,_S_in);
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2e0 = __return_storage_ptr__;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: unable to open instance file: ",0x25);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(organ_filename->_M_dataplus)._M_p,
                        organ_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", stopping! \n",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##Reading volume files.",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_2c0,cVar2);
  lVar4 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar4] & 5) == 0) {
    do {
      cVar2 = std::ios::widen((char)auStack_2e8 + (char)lVar4 + -0x50);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_2c0,cVar2);
      if (local_2c0._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##  ",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_2c0._M_dataplus._M_p,
                            local_2c0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2d8,&local_2c0);
      }
      lVar4 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar4] & 5) == 0);
  }
  std::ifstream::close();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##  Read ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," files",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      lVar1 = *(long *)((long)local_2d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,lVar1,
                 *(long *)((long)&((local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar4) + lVar1);
      imrt::Volume::Volume(&local_278,local_2a0,&local_298);
      std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
                (local_2e0,&local_278);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree(&local_278.D._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)local_2d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_2d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::ifstream::~ifstream(local_238);
  return local_2e0;
}

Assistant:

vector<Volume> createVolumes (string organ_filename, Collimator& collimator){
  ifstream organ_file(organ_filename.c_str(), ios::in);
  vector<string> organ_files;
  vector<Volume> volumes;
  string line;

  if (! organ_file)
    cerr << "ERROR: unable to open instance file: " << organ_filename << ", stopping! \n";

  cout << "##Reading volume files." << endl;
  getline(organ_file, line);
  while (organ_file) {
    getline(organ_file, line);
    if (line.empty()) continue;
    cout << "##  " << line << endl;
    //Assuming one data point
    organ_files.push_back(line);
  }
  organ_file.close();
  cout << "##  Read " << organ_files.size() << " files"<< endl;

  for (int i=0; i<organ_files.size(); i++)
    volumes.push_back(Volume(collimator, organ_files[i]));

  return(volumes);
}